

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::register_read
          (Compiler *this,uint32_t expr,uint32_t chain,bool forwarded)

{
  bool bVar1;
  uint32_t id;
  SPIRExpression *pSVar2;
  SPIRVariable *pSVar3;
  SPIRVariable *var;
  SPIRExpression *e;
  bool forwarded_local;
  uint32_t chain_local;
  uint32_t expr_local;
  Compiler *this_local;
  
  pSVar2 = get<diligent_spirv_cross::SPIRExpression>(this,expr);
  pSVar3 = maybe_get_backing_variable(this,chain);
  if (pSVar3 != (SPIRVariable *)0x0) {
    (pSVar2->loaded_from).id = (pSVar3->super_IVariant).self.id;
    if (forwarded) {
      id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar3->super_IVariant).self);
      bVar1 = is_immutable(this,id);
      if (!bVar1) {
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                  (&pSVar3->dependees,&(pSVar2->super_IVariant).self);
      }
    }
    if ((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->parameter != (Parameter *)0x0)) {
      pSVar3->parameter->read_count = pSVar3->parameter->read_count + 1;
    }
  }
  return;
}

Assistant:

void Compiler::register_read(uint32_t expr, uint32_t chain, bool forwarded)
{
	auto &e = get<SPIRExpression>(expr);
	auto *var = maybe_get_backing_variable(chain);

	if (var)
	{
		e.loaded_from = var->self;

		// If the backing variable is immutable, we do not need to depend on the variable.
		if (forwarded && !is_immutable(var->self))
			var->dependees.push_back(e.self);

		// If we load from a parameter, make sure we create "inout" if we also write to the parameter.
		// The default is "in" however, so we never invalidate our compilation by reading.
		if (var && var->parameter)
			var->parameter->read_count++;
	}
}